

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

uint setup_obmc_center_error
               (MV *this_mv,SUBPEL_SEARCH_VAR_PARAMS *var_params,MV_COST_PARAMS *mv_cost_params,
               uint *sse1,int *distortion)

{
  int iVar1;
  int iVar2;
  undefined8 in_RCX;
  long *in_RSI;
  int *in_R8;
  uint besterr;
  int ref_stride;
  uint8_t *ref;
  int32_t *mask;
  int32_t *wsrc;
  MSBuffers *ms_buffers;
  MV *in_stack_ffffffffffffffa8;
  
  iVar1 = (**(code **)(*in_RSI + 0x60))
                    (*(undefined8 *)in_RSI[2],*(undefined4 *)(in_RSI[2] + 0x18),in_RSI[7],in_RSI[8],
                     in_RCX);
  *in_R8 = iVar1;
  iVar2 = mv_err_cost_(in_stack_ffffffffffffffa8,(MV_COST_PARAMS *)0x27ef9a);
  return iVar2 + iVar1;
}

Assistant:

static unsigned int setup_obmc_center_error(
    const MV *this_mv, const SUBPEL_SEARCH_VAR_PARAMS *var_params,
    const MV_COST_PARAMS *mv_cost_params, unsigned int *sse1, int *distortion) {
  // TODO(chiyotsai@google.com): There might be a bug here where we didn't use
  // get_buf_from_mv(ref, *this_mv).
  const MSBuffers *ms_buffers = &var_params->ms_buffers;
  const int32_t *wsrc = ms_buffers->wsrc;
  const int32_t *mask = ms_buffers->obmc_mask;
  const uint8_t *ref = ms_buffers->ref->buf;
  const int ref_stride = ms_buffers->ref->stride;
  unsigned int besterr =
      var_params->vfp->ovf(ref, ref_stride, wsrc, mask, sse1);
  *distortion = besterr;
  besterr += mv_err_cost_(this_mv, mv_cost_params);
  return besterr;
}